

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int createCollation(sqlite3 *db,char *zName,u8 enc,void *pCtx,
                   _func_int_void_ptr_int_void_ptr_int_void_ptr *xCompare,_func_void_void_ptr *xDel)

{
  byte bVar1;
  CollSeq *pCVar2;
  void *in_RCX;
  byte in_DL;
  sqlite3 *in_RDI;
  _func_int_void_ptr_int_void_ptr_int_void_ptr *in_R8;
  _func_void_void_ptr *in_R9;
  CollSeq *p;
  int j;
  CollSeq *aColl;
  int enc2;
  CollSeq *pColl;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  sqlite3 *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  u8 enc_00;
  sqlite3 *in_stack_ffffffffffffffb0;
  int local_4;
  
  if ((in_DL == 4) || (bVar1 = in_DL, in_DL == 8)) {
    bVar1 = 2;
  }
  if ((bVar1 == 0) || (3 < bVar1)) {
    local_4 = sqlite3MisuseError(0);
  }
  else {
    pCVar2 = sqlite3FindCollSeq(in_stack_ffffffffffffffb0,
                                (u8)((uint)in_stack_ffffffffffffffac >> 0x18),
                                (char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    enc_00 = (u8)((uint)in_stack_ffffffffffffffac >> 0x18);
    if ((pCVar2 != (CollSeq *)0x0) &&
       (pCVar2->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)) {
      if (in_RDI->nVdbeActive != 0) {
        sqlite3ErrorWithMsg(in_RDI,5,
                            "unable to delete/modify collation sequence due to active statements");
        return 5;
      }
      sqlite3ExpirePreparedStatements(in_RDI,0);
      if ((pCVar2->enc & 0xf7) == bVar1) {
        in_stack_ffffffffffffffb0 =
             (sqlite3 *)
             sqlite3HashFind((Hash *)in_stack_ffffffffffffffa0,
                             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        for (in_stack_ffffffffffffffac = 0; in_stack_ffffffffffffffac < 3;
            in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1) {
          in_stack_ffffffffffffffa0 =
               (sqlite3 *)(&in_stack_ffffffffffffffb0->pVfs + (long)in_stack_ffffffffffffffac * 5);
          if (*(u8 *)&in_stack_ffffffffffffffa0->pVdbe == pCVar2->enc) {
            if (in_stack_ffffffffffffffa0->aDb != (Db *)0x0) {
              (*(code *)in_stack_ffffffffffffffa0->aDb)(in_stack_ffffffffffffffa0->pDfltColl);
            }
            in_stack_ffffffffffffffa0->mutex = (sqlite3_mutex *)0x0;
          }
        }
      }
      enc_00 = (u8)((uint)in_stack_ffffffffffffffac >> 0x18);
    }
    pCVar2 = sqlite3FindCollSeq(in_stack_ffffffffffffffb0,enc_00,(char *)in_stack_ffffffffffffffa0,
                                in_stack_ffffffffffffff9c);
    if (pCVar2 == (CollSeq *)0x0) {
      local_4 = 7;
    }
    else {
      pCVar2->xCmp = in_R8;
      pCVar2->pUser = in_RCX;
      pCVar2->xDel = in_R9;
      pCVar2->enc = bVar1 | in_DL & 8;
      sqlite3Error(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int createCollation(
  sqlite3* db,
  const char *zName,
  u8 enc,
  void* pCtx,
  int(*xCompare)(void*,int,const void*,int,const void*),
  void(*xDel)(void*)
){
  CollSeq *pColl;
  int enc2;

  assert( sqlite3_mutex_held(db->mutex) );

  /* If SQLITE_UTF16 is specified as the encoding type, transform this
  ** to one of SQLITE_UTF16LE or SQLITE_UTF16BE using the
  ** SQLITE_UTF16NATIVE macro. SQLITE_UTF16 is not used internally.
  */
  enc2 = enc;
  testcase( enc2==SQLITE_UTF16 );
  testcase( enc2==SQLITE_UTF16_ALIGNED );
  if( enc2==SQLITE_UTF16 || enc2==SQLITE_UTF16_ALIGNED ){
    enc2 = SQLITE_UTF16NATIVE;
  }
  if( enc2<SQLITE_UTF8 || enc2>SQLITE_UTF16BE ){
    return SQLITE_MISUSE_BKPT;
  }

  /* Check if this call is removing or replacing an existing collation
  ** sequence. If so, and there are active VMs, return busy. If there
  ** are no active VMs, invalidate any pre-compiled statements.
  */
  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 0);
  if( pColl && pColl->xCmp ){
    if( db->nVdbeActive ){
      sqlite3ErrorWithMsg(db, SQLITE_BUSY,
        "unable to delete/modify collation sequence due to active statements");
      return SQLITE_BUSY;
    }
    sqlite3ExpirePreparedStatements(db, 0);

    /* If collation sequence pColl was created directly by a call to
    ** sqlite3_create_collation, and not generated by synthCollSeq(),
    ** then any copies made by synthCollSeq() need to be invalidated.
    ** Also, collation destructor - CollSeq.xDel() - function may need
    ** to be called.
    */
    if( (pColl->enc & ~SQLITE_UTF16_ALIGNED)==enc2 ){
      CollSeq *aColl = sqlite3HashFind(&db->aCollSeq, zName);
      int j;
      for(j=0; j<3; j++){
        CollSeq *p = &aColl[j];
        if( p->enc==pColl->enc ){
          if( p->xDel ){
            p->xDel(p->pUser);
          }
          p->xCmp = 0;
        }
      }
    }
  }

  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 1);
  if( pColl==0 ) return SQLITE_NOMEM_BKPT;
  pColl->xCmp = xCompare;
  pColl->pUser = pCtx;
  pColl->xDel = xDel;
  pColl->enc = (u8)(enc2 | (enc & SQLITE_UTF16_ALIGNED));
  sqlite3Error(db, SQLITE_OK);
  return SQLITE_OK;
}